

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StegerMatch.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  StegerMatch match;
  Mat myTemplate;
  Mat myInput;
  Mat saving_image;
  Mat myOutput;
  void *local_378;
  undefined8 uStack_370;
  long local_368;
  _InputArray local_360;
  undefined1 local_348 [16];
  uchar *apuStack_338 [12];
  Mat local_2d8;
  Mat local_278;
  StegerMatch local_1e8;
  Mat local_1b0;
  Mat local_150;
  Mat local_f0;
  Mat local_90;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hello Steger2002 matcher!",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_348._0_8_ = (Mat *)apuStack_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,"C:/Users/hisham/stegerMatch/template.jpg","");
  cv::imread((string *)&local_1b0,(int)local_348);
  if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
  }
  local_150.flags = 300;
  local_150.dims = 0x96;
  local_150.rows = 0x15e;
  local_150.cols = 200;
  cv::Mat::Mat((Mat *)local_348,&local_1b0,(Rect_ *)&local_150);
  cv::Mat::operator=(&local_1b0,(Mat *)local_348);
  cv::Mat::~Mat((Mat *)local_348);
  local_348._0_8_ = (Mat *)apuStack_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,"C:/Users/hisham/stegerMatch/input.jpg","");
  cv::imread((string *)&local_150,(int)local_348);
  if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
  }
  local_1e8.mTemplateLoaded = false;
  local_1e8.mParameters.mMinRotation = 0.0;
  local_1e8.mParameters.mMaxRotation = 360.0;
  local_1e8.mParameters.mNumRotationSteps = 10.0;
  local_1e8.mParameters.mMinScale = 0.1;
  local_1e8.mParameters.mMaxScale = 2.0;
  local_1e8.mParameters.mNumScaleSteps = 10.0;
  local_1e8.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StegerMatch::loadTemplate(&local_1e8,&local_1b0);
  if (local_1e8.mTemplateLoaded == true) {
    cv::Mat::Mat(&local_90);
    StegerMatch::processFrame(&local_1e8,&local_150,&local_90);
    cv::operator*((Mat *)local_348,256.0);
    cv::Mat::Mat(&local_f0);
    (**(code **)(*(long *)local_348._0_8_ + 0x18))(local_348._0_8_,local_348,&local_f0,0xffffffff);
    cv::Mat::~Mat(&local_278);
    cv::Mat::~Mat(&local_2d8);
    cv::Mat::~Mat((Mat *)apuStack_338);
    apuStack_338[0] = (uchar *)0x0;
    local_348._0_4_ = 0x2010000;
    local_348._8_8_ = &local_f0;
    cv::Mat::convertTo((_OutputArray *)&local_f0,(int)local_348,1.0,0.0);
    local_348._0_8_ = (Mat *)apuStack_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"output.jpg","");
    local_360.sz.width = 0;
    local_360.sz.height = 0;
    local_360.flags = 0x1010000;
    local_368 = 0;
    local_378 = (void *)0x0;
    uStack_370 = 0;
    local_360.obj = &local_f0;
    cv::imwrite((string *)local_348,&local_360,(vector *)&local_378);
    if (local_378 != (void *)0x0) {
      operator_delete(local_378,local_368 - (long)local_378);
    }
    if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
      operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
    }
    local_348._0_8_ = (Mat *)apuStack_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"template","");
    local_360.sz.width = 0;
    local_360.sz.height = 0;
    local_360.flags = 0x1010000;
    local_360.obj = &local_1b0;
    cv::imshow((string *)local_348,&local_360);
    if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
      operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
    }
    local_348._0_8_ = (Mat *)apuStack_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"input","");
    local_360.sz.width = 0;
    local_360.sz.height = 0;
    local_360.flags = 0x1010000;
    local_360.obj = &local_150;
    cv::imshow((string *)local_348,&local_360);
    if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
      operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
    }
    local_348._0_8_ = (Mat *)apuStack_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"output","");
    local_360.sz.width = 0;
    local_360.sz.height = 0;
    local_360.flags = 0x1010000;
    local_360.obj = &local_90;
    cv::imshow((string *)local_348,&local_360);
    if ((Mat *)local_348._0_8_ != (Mat *)apuStack_338) {
      operator_delete((void *)local_348._0_8_,(ulong)(apuStack_338[0] + 1));
    }
    cv::waitKey(0);
    cv::Mat::~Mat(&local_f0);
    cv::Mat::~Mat(&local_90);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Template was not loaded.",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  std::vector<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>::~vector
            (&local_1e8.mTemplateSet);
  cv::Mat::~Mat(&local_150);
  cv::Mat::~Mat(&local_1b0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    cout << "Hello Steger2002 matcher!" << endl;
    
    Mat myTemplate = imread("C:/Users/hisham/stegerMatch/template.jpg");
    //create ROI on the template image to only include the object... fill in the right values
	myTemplate = myTemplate(Rect(Point(300, 150), Size(350, 200)));
    
    Mat myInput = imread("C:/Users/hisham/stegerMatch/input.jpg");
	//Mat myInput = imread("C:/Users/hisham/stegerMatch/template2.jpg");
    


    StegerMatch match;	
    match.loadTemplate(myTemplate);
	
    if (match.isTemplateLoaded()) {
        Mat myOutput;
        match.processFrame(myInput, myOutput);
        
		Mat saving_image=myOutput*256;
		saving_image.convertTo(saving_image, CV_8UC1);
		imwrite("output.jpg", saving_image);


        imshow("template",  myTemplate);
        imshow("input",     myInput);
        imshow("output",    myOutput);
        waitKey(0);
    } else {
        cerr << "Template was not loaded." << endl;
    }
	
	
    
    return 0;
}